

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O1

void parse_partname(string *part_name)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  string frame;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  lVar1 = std::__cxx11::string::rfind((char *)part_name,0x10c039,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)part_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  lVar1 = std::__cxx11::string::rfind((char *)part_name,0x10c03b,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)part_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    lVar1 = std::__cxx11::string::rfind((char *)part_name,0x10c040,0xffffffffffffffff);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)part_name);
      plVar3 = local_68;
      plVar2 = local_68;
      lVar1 = local_60;
      while ((lVar1 != 0 && (plVar3 = plVar2, (int)(char)*plVar2 - 0x30U < 10))) {
        plVar2 = (long *)((long)plVar2 + 1);
        lVar1 = lVar1 + -1;
        plVar3 = (long *)((long)local_68 + local_60);
      }
      if (plVar3 == (long *)((long)local_68 + local_60) && local_60 != 0) {
        std::__cxx11::string::substr((ulong)local_48,(ulong)part_name);
        std::__cxx11::string::operator=((string *)part_name,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void
parse_partname (string& part_name)
{
    // strip off a path delimitation
    size_t posSlash = part_name.rfind (IMF_PATH_SEPARATOR);
    if (posSlash != string::npos) part_name = part_name.substr (posSlash + 1);

    // strip the exr ext
    size_t pos = part_name.rfind (".exr");
    if (pos != string::npos)
    {
        part_name = part_name.substr (0, pos);

        // strip off the frame number
        size_t pos2 = part_name.rfind (".");
        if (pos2 != string::npos)
        {
            string frame = part_name.substr (pos2 + 1, pos);
            if (is_number (frame)) part_name = part_name.substr (0, pos2);
        }
    }
}